

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

uint32 __thiscall
Js::TypedArrayBase::ValidateAndReturnIndex
          (TypedArrayBase *this,Var index,bool *skipOperation,bool *isNumericIndex)

{
  bool bVar1;
  uint uVar2;
  BOOL BVar3;
  uint uVar4;
  JavascriptString *aValue;
  double dVar5;
  double local_38;
  
  *skipOperation = false;
  *isNumericIndex = true;
  uVar4 = (this->super_ArrayBufferParent).super_ArrayObject.length;
  bVar1 = TaggedInt::Is(index);
  if (bVar1) {
    uVar2 = TaggedInt::ToInt32(index);
    *skipOperation = uVar4 <= uVar2 || (int)uVar2 < 0;
    return uVar2;
  }
  local_38 = 0.0;
  bVar1 = VarIs<Js::JavascriptString>(index);
  if (bVar1) {
    aValue = VarTo<Js::JavascriptString>(index);
    BVar3 = JavascriptConversion::CanonicalNumericIndexString
                      (aValue,&local_38,
                       (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr);
    if (BVar3 == 0) {
      *isNumericIndex = false;
    }
    else {
      BVar3 = JavascriptNumber::IsNegZero(local_38);
      if (BVar3 == 0) goto LAB_00bfa955;
      *skipOperation = true;
    }
    uVar4 = 0;
  }
  else {
    local_38 = JavascriptNumber::GetValue(index);
LAB_00bfa955:
    uVar4 = (uint)(long)local_38;
    dVar5 = (double)((long)local_38 & 0xffffffff);
    if (((local_38 != dVar5) || (NAN(local_38) || NAN(dVar5))) ||
       ((this->super_ArrayBufferParent).super_ArrayObject.length <= uVar4)) {
      *skipOperation = true;
    }
  }
  return uVar4;
}

Assistant:

_Use_decl_annotations_ uint32 TypedArrayBase::ValidateAndReturnIndex(Js::Var index, bool * skipOperation, bool * isNumericIndex)
    {
        *skipOperation = false;
        *isNumericIndex = true;
        uint32 length = GetLength();

        if (TaggedInt::Is(index))
        {
            int32 indexInt = TaggedInt::ToInt32(index);
            *skipOperation = (indexInt < 0 || (uint32)indexInt >= length);
            return (uint32)indexInt;
        }
        else
        {
            double dIndexValue = 0;
            if (VarIs<JavascriptString>(index))
            {
                if (JavascriptConversion::CanonicalNumericIndexString(VarTo<JavascriptString>(index), &dIndexValue, GetScriptContext()))
                {
                    if (JavascriptNumber::IsNegZero(dIndexValue))
                    {
                        *skipOperation = true;
                        return 0;
                    }
                    // If this is numeric index embedded in string, perform regular numeric index checks below
                }
                else
                {
                    // not numeric index, go the [[Set]] path to add as string property
                    *isNumericIndex = false;
                    return 0;
                }
            }
            else
            {
                // JavascriptNumber::Is_NoTaggedIntCheck(index)
                dIndexValue = JavascriptNumber::GetValue(index);
            }

            // OK to lose data because we want to verify ToInteger()
            uint32 uint32Index = (uint32)dIndexValue;

            // IsInteger()
            if ((double)uint32Index != dIndexValue)
            {
                *skipOperation = true;
            }
            // index >= length
            else if (uint32Index >= GetLength())
            {
                *skipOperation = true;
            }
            return uint32Index;
        }
    }